

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symlink.cpp
# Opt level: O0

bool fs_create_symlink(string_view target,string_view link)

{
  string_view path2;
  string_view path1;
  string_view path;
  bool bVar1;
  char *pcVar2;
  error_code eVar3;
  string_view local_158;
  error_category *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  byte local_121;
  path local_120;
  byte local_f1;
  path local_f0;
  byte local_c5;
  path local_b8;
  byte local_89;
  path local_88;
  char *local_60;
  char *local_58;
  int local_50;
  undefined4 uStack_4c;
  error_category *local_48;
  undefined1 local_40 [8];
  error_code ec;
  string_view link_local;
  string_view target_local;
  
  link_local._M_len = (size_t)link._M_str;
  ec._M_cat = (error_category *)link._M_len;
  pcVar2 = target._M_str;
  link_local._M_str = (char *)target._M_len;
  std::error_code::error_code((error_code *)local_40);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&link_local._M_str);
  if ((bVar1) ||
     (bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)&ec._M_cat), bVar1)) {
    eVar3 = std::make_error_code(invalid_argument);
    local_48 = eVar3._M_cat;
    local_50 = eVar3._M_value;
    local_40._4_4_ = uStack_4c;
    local_40._0_4_ = local_50;
    ec._0_8_ = local_48;
  }
  else {
    local_60 = link_local._M_str;
    path._M_str = pcVar2;
    path._M_len = (size_t)link_local._M_str;
    local_58 = pcVar2;
    bVar1 = fs_is_dir(path);
    local_89 = 0;
    local_c5 = 0;
    local_f1 = 0;
    local_121 = 0;
    if (bVar1) {
      std::filesystem::__cxx11::path::
      path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
                (&local_88,(basic_string_view<char,_std::char_traits<char>_> *)&link_local._M_str,
                 auto_format);
      local_89 = 1;
      std::filesystem::__cxx11::path::
      path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
                (&local_b8,(basic_string_view<char,_std::char_traits<char>_> *)&ec._M_cat,
                 auto_format);
      local_c5 = 1;
      std::filesystem::create_directory_symlink(&local_88,&local_b8,(error_code *)local_40);
    }
    else {
      std::filesystem::__cxx11::path::
      path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
                (&local_f0,(basic_string_view<char,_std::char_traits<char>_> *)&link_local._M_str,
                 auto_format);
      local_f1 = 1;
      std::filesystem::__cxx11::path::
      path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
                (&local_120,(basic_string_view<char,_std::char_traits<char>_> *)&ec._M_cat,
                 auto_format);
      local_121 = 1;
      std::filesystem::create_symlink(&local_f0,&local_120,(error_code *)local_40);
    }
    if ((local_121 & 1) != 0) {
      std::filesystem::__cxx11::path::~path(&local_120);
    }
    if ((local_f1 & 1) != 0) {
      std::filesystem::__cxx11::path::~path(&local_f0);
    }
    if ((local_c5 & 1) != 0) {
      std::filesystem::__cxx11::path::~path(&local_b8);
    }
    if ((local_89 & 1) != 0) {
      std::filesystem::__cxx11::path::~path(&local_88);
    }
    bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_40);
    if (!bVar1) {
      return true;
    }
  }
  local_138 = link_local._M_str;
  local_148 = ec._M_cat;
  local_140 = (char *)link_local._M_len;
  local_130 = pcVar2;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_158,"fs_create_symlink");
  path1._M_str = local_130;
  path1._M_len = (size_t)local_138;
  path2._M_str = local_140;
  path2._M_len = (size_t)local_148;
  fs_print_error(path1,path2,local_158,(error_code *)local_40);
  return false;
}

Assistant:

bool fs_create_symlink(std::string_view target, std::string_view link)
{
  // create symlink to file or directory

  std::error_code ec;

  // confusing program errors if target is "" -- we'd never make such a symlink in real use.
  // macOS needs empty check to avoid SIGABRT

  if(target.empty() || link.empty()) FFS_UNLIKELY
    ec = std::make_error_code(std::errc::invalid_argument);
  else {
#if defined(__MINGW32__) || (defined(_WIN32) && !defined(HAVE_CXX_FILESYSTEM))

  DWORD p = SYMBOLIC_LINK_FLAG_ALLOW_UNPRIVILEGED_CREATE;

  if(fs_is_dir(target.data()))
    p |= SYMBOLIC_LINK_FLAG_DIRECTORY;

  if(CreateSymbolicLinkA(link.data(), target.data(), p))  FFS_LIKELY
    return true;

#elif defined(HAVE_CXX_FILESYSTEM)

  fs_is_dir(target)
    ? std::filesystem::create_directory_symlink(target, link, ec)
    : std::filesystem::create_symlink(target, link, ec);

  if(!ec) FFS_LIKELY
    return true;

#else
  // https://developer.apple.com/library/archive/documentation/System/Conceptual/ManPages_iPhoneOS/man2/symlink.2.html
  // https://linux.die.net/man/3/symlink
  if(symlink(target.data(), link.data()) == 0)  FFS_LIKELY
    return true;
#endif
  }

  fs_print_error(target, link, __func__, ec);
  return false;
}